

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O0

bool __thiscall
YAML::EmitterState::SetNullFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  bool bVar1;
  int in_ESI;
  value in_stack_00000040;
  EMITTER_MANIP in_stack_00000044;
  Setting<YAML::EMITTER_MANIP> *in_stack_00000048;
  EmitterState *in_stack_00000050;
  
  bVar1 = in_ESI - 9U < 4;
  if (bVar1) {
    _Set<YAML::EMITTER_MANIP>
              (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
  }
  return bVar1;
}

Assistant:

bool EmitterState::SetNullFormat(EMITTER_MANIP value, FmtScope::value scope) {
  switch (value) {
    case LowerNull:
    case UpperNull:
    case CamelNull:
    case TildeNull:
      _Set(m_nullFmt, value, scope);
      return true;
    default:
      return false;
  }
}